

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

QSize __thiscall QSplitter::sizeHint(QSplitter *this)

{
  long lVar1;
  long *plVar2;
  Representation RVar3;
  ulong uVar4;
  QSize QVar5;
  Representation RVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  QWidget::ensurePolished((QWidget *)this);
  if (*(long *)(lVar1 + 0x298) == 0) {
    RVar6.m_i = 0;
    iVar10 = 0;
  }
  else {
    uVar9 = 0;
    iVar10 = 0;
    RVar6.m_i = 0;
    do {
      plVar2 = *(long **)(*(long *)(*(long *)(lVar1 + 0x290) + uVar9 * 8) + 0x18);
      iVar7 = RVar6.m_i;
      if (((*(byte *)(plVar2[4] + 10) & 1) == 0) &&
         (uVar4 = (**(code **)(*plVar2 + 0x70))(), (uVar4 & 0x8000000080000000) == 0)) {
        iVar7 = (int)(uVar4 >> 0x20);
        iVar8 = iVar7;
        if (*(int *)(lVar1 + 0x2a0) == 1) {
          iVar8 = (int)uVar4;
        }
        iVar10 = iVar10 + iVar8;
        if (*(int *)(lVar1 + 0x2a0) == 2) {
          iVar7 = (int)uVar4;
        }
        if (iVar7 < RVar6.m_i) {
          iVar7 = RVar6.m_i;
        }
      }
      RVar6.m_i = iVar7;
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(ulong *)(lVar1 + 0x298));
  }
  RVar3.m_i = iVar10;
  if (*(int *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x2a0) == 1) {
    RVar3.m_i = RVar6.m_i;
    RVar6.m_i = iVar10;
  }
  QVar5.ht.m_i = RVar3.m_i;
  QVar5.wd.m_i = RVar6.m_i;
  return QVar5;
}

Assistant:

QSize QSplitter::sizeHint() const
{
    Q_D(const QSplitter);
    ensurePolished();
    int l = 0;
    int t = 0;
    for (int i = 0; i < d->list.size(); ++i) {
        QWidget *w = d->list.at(i)->widget;
        if (w->isHidden())
            continue;
        QSize s = w->sizeHint();
        if (s.isValid()) {
            l += d->pick(s);
            t = qMax(t, d->trans(s));
        }
    }
    return orientation() == Qt::Horizontal ? QSize(l, t) : QSize(t, l);
}